

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  int p3;
  byte bVar1;
  i16 iVar2;
  i16 iVar3;
  i16 iVar4;
  int p2;
  int iVar5;
  int iVar6;
  Vdbe *p;
  ulong uVar7;
  Parse *pPVar8;
  char *zP4;
  Op *pOVar9;
  int p2_00;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  p = sqlite3GetVdbe(pParse);
  iVar11 = pParse->nTab;
  p2_00 = pParse->nLabel + -1;
  pParse->nLabel = p2_00;
  if (nIncr < 0) {
    sqlite3VdbeAddOp3(p,0x31,(uint)pFKey->isDeferred,p2_00,0);
  }
  uVar7 = (ulong)(uint)pFKey->nCol;
  if (0 < pFKey->nCol) {
    lVar12 = 0;
    do {
      iVar2 = sqlite3TableColumnToStorage(pFKey->pFrom,(i16)aiCol[lVar12]);
      sqlite3VdbeAddOp3(p,0x33,(int)iVar2 + regData + 1,p2_00,0);
      lVar12 = lVar12 + 1;
      uVar7 = (ulong)pFKey->nCol;
    } while (lVar12 < (long)uVar7);
  }
  iVar11 = iVar11 + -1;
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      if (pParse->nTempReg == '\0') {
        p2 = pParse->nMem + 1;
        pParse->nMem = p2;
      }
      else {
        bVar1 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar1;
        p2 = pParse->aTempReg[bVar1];
      }
      iVar2 = sqlite3TableColumnToStorage(pFKey->pFrom,(i16)*aiCol);
      sqlite3VdbeAddOp3(p,0x51,regData + iVar2 + 1,p2,0);
      iVar6 = sqlite3VdbeAddOp3(p,0xd,p2,0,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x36,regData,p2_00,p2);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 0x90;
        }
      }
      sqlite3OpenTable(pParse,iVar11,iDb,pTab,0x66);
      sqlite3VdbeAddOp3(p,0x1f,iVar11,0,p2);
      sqlite3VdbeAddOp3(p,9,0,p2_00,0);
      iVar5 = p->nOp;
      if (p->db->mallocFailed == '\0') {
        pOVar9 = p->aOp;
        pOVar9[(long)iVar5 + -2].p2 = iVar5;
        pOVar9 = pOVar9 + iVar6;
      }
      else {
        pOVar9 = (Op *)&sqlite3VdbeGetOp_dummy;
        DAT_00244348 = iVar5;
      }
      pOVar9->p2 = iVar5;
    }
    else {
      iVar6 = (int)uVar7;
      p2 = sqlite3GetTempRange(pParse,iVar6);
      sqlite3VdbeAddOp3(p,0x66,iVar11,pIdx->tnum,iDb);
      sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
      if (0 < iVar6) {
        uVar10 = 0;
        do {
          iVar2 = sqlite3TableColumnToStorage(pFKey->pFrom,(i16)aiCol[uVar10]);
          sqlite3VdbeAddOp3(p,0x50,(int)iVar2 + regData + 1,(int)uVar10 + p2,0);
          uVar10 = uVar10 + 1;
        } while ((uVar7 & 0xffffffff) != uVar10);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        if (0 < iVar6) {
          iVar5 = p->nOp;
          uVar10 = 0;
          do {
            iVar3 = sqlite3TableColumnToStorage(pFKey->pFrom,(i16)aiCol[uVar10]);
            iVar2 = pIdx->aiColumn[uVar10];
            iVar4 = sqlite3TableColumnToStorage(pIdx->pTable,iVar2);
            p3 = (int)iVar4 + regData + 1;
            if (iVar2 == pTab->iPKey) {
              p3 = regData;
            }
            sqlite3VdbeAddOp3(p,0x35,(int)iVar3 + regData + 1,iVar5 + iVar6 + 1,p3);
            if (0 < (long)p->nOp) {
              p->aOp[(long)p->nOp + -1].p5 = 0x10;
            }
            uVar10 = uVar10 + 1;
          } while ((uVar7 & 0xffffffff) != uVar10);
        }
        sqlite3VdbeAddOp3(p,9,0,p2_00,0);
      }
      zP4 = pIdx->zColAff;
      if (zP4 == (char *)0x0) {
        zP4 = computeIndexAffStr(pParse->db,pIdx);
      }
      iVar5 = sqlite3VdbeAddOp3(p,0x60,p2,iVar6,0);
      sqlite3VdbeChangeP4(p,iVar5,zP4,iVar6);
      sqlite3VdbeAddOp4Int(p,0x1d,iVar11,p2_00,p2,iVar6);
      if (iVar6 != 1) {
        if (pParse->nRangeReg < iVar6) {
          pParse->nRangeReg = iVar6;
          pParse->iRangeReg = p2;
        }
        goto LAB_001a793e;
      }
    }
    if (p2 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = p2;
      }
    }
  }
LAB_001a793e:
  bVar1 = pFKey->isDeferred;
  if ((((bVar1 == 0) && ((pParse->db->flags & 0x80000) == 0)) && (pParse->pToplevel == (Parse *)0x0)
      ) && (pParse->isMultiWrite == '\0')) {
    sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
  }
  else {
    if (0 < nIncr && bVar1 == 0) {
      pPVar8 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar8 = pParse;
      }
      pPVar8->mayAbort = '\x01';
    }
    sqlite3VdbeAddOp3(p,0x9e,(uint)bVar1,nIncr,0);
  }
  sqlite3VdbeResolveLabel(p,p2_00);
  sqlite3VdbeAddOp3(p,0x7a,iVar11,0,0);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(pParse);   /* jump here if parent key found */

  sqlite3VdbeVerifyAbortable(v,
    (!pFKey->isDeferred
      && !(pParse->db->flags & SQLITE_DeferFKs)
      && !pParse->pToplevel
      && !pParse->isMultiWrite) ? OE_Abort : OE_Ignore);

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If
  ** any are, then the constraint is considered satisfied. No need to
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
    VdbeCoverage(v);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[i]) + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk); VdbeCoverage(v);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);

      /* Invoke MustBeInt to coerce the child key value to an integer (i.e.
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy,
        sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[0])+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
      VdbeCoverage(v);

      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, SQLITE_NOTNULL);
      }

      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp); VdbeCoverage(v);
      sqlite3VdbeGoto(v, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);

      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy,
               sqlite3TableColumnToStorage(pFKey->pFrom, aiCol[i])+1+regData,
               regTemp+i);
      }

      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.
      **
      ** If any of the parent-key values are NULL, then the row cannot match
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = sqlite3TableColumnToStorage(pFKey->pFrom,aiCol[i])
                              +1+regData;
          int iParent = 1+regData;
          iParent += sqlite3TableColumnToStorage(pIdx->pTable,
                                                 pIdx->aiColumn[i]);
          assert( pIdx->aiColumn[i]>=0 );
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent); VdbeCoverage(v);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeGoto(v, iOk);
      }

      sqlite3VdbeAddOp4(v, OP_Affinity, regTemp, nCol, 0,
                        sqlite3IndexAffinityStr(pParse->db,pIdx), nCol);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regTemp, nCol);
      VdbeCoverage(v);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !(pParse->db->flags & SQLITE_DeferFKs)
   && !pParse->pToplevel
   && !pParse->isMultiWrite
  ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3MayAbort(pParse);
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}